

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O1

iterator * __thiscall
idx2::Delete<unsigned_long,idx2::brick_volume>
          (iterator *__return_storage_ptr__,idx2 *this,
          hash_table<unsigned_long,_idx2::brick_volume> *Ht,unsigned_long *Key)

{
  byte bVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  ulong uVar4;
  
  bVar1 = (byte)*(undefined8 *)(this + 0x20);
  uVar4 = (ulong)((long)Ht->Keys * -0x61c8864680b583eb) >> (-bVar1 & 0x3f);
  uVar3 = uVar4;
  do {
    if (*(char *)(*(long *)(this + 0x10) + uVar3) == '\0') break;
    if (*(unsigned_long **)(*(long *)this + uVar3 * 8) == Ht->Keys) {
      puVar2 = (unsigned_long *)(*(long *)this + uVar3 * 8);
      *(undefined1 *)(*(long *)(this + 0x10) + uVar3) = 1;
      *(long *)(this + 0x18) = *(long *)(this + 0x18) + -1;
      goto LAB_0017afa1;
    }
    uVar3 = uVar3 + 1 & ~(-1L << (bVar1 & 0x3f));
  } while (uVar3 != uVar4);
  uVar3 = 1L << (bVar1 & 0x3f);
  puVar2 = (unsigned_long *)(uVar3 * 8 + *(long *)this);
LAB_0017afa1:
  __return_storage_ptr__->Key = puVar2;
  __return_storage_ptr__->Val = (brick_volume *)(uVar3 * 0x40 + *(long *)(this + 8));
  __return_storage_ptr__->Ht = (hash_table<unsigned_long,_idx2::brick_volume> *)this;
  __return_storage_ptr__->Idx = uVar3;
  return __return_storage_ptr__;
}

Assistant:

typename hash_table<k, v>::iterator
Delete(hash_table<k, v>* Ht, const k& Key)
{
  i64 H = Index(*Ht, Hash(Key));
  i64 Start = H;
  bool Found = false;
  while (Ht->Stats[H] != hash_table<k, v>::Empty)
  {
    if (Ht->Keys[H] == Key)
    {
      Ht->Stats[H] = hash_table<k, v>::Tombstone;
      --Ht->Size;
      idx2_Assert(Ht->Size >= 0);
      Found = true;
      return IterAt(*Ht, H);
    }
    ++H;
    if ((H &= Capacity(*Ht) - 1) == Start)
      break;
  }
  if (Found)
  {
    idx2_Assert(Ht->Keys[H] == Key);
  }
  idx2_Assert(Found);
  return End(*Ht);
}